

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.h
# Opt level: O0

string * __thiscall
Assimp::ColladaExporter::GetMeshId_abi_cxx11_
          (string *__return_storage_ptr__,ColladaExporter *this,size_t pIndex)

{
  string local_78;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  size_t local_20;
  size_t pIndex_local;
  ColladaExporter *this_local;
  
  local_20 = pIndex;
  pIndex_local = (size_t)this;
  this_local = (ColladaExporter *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"meshId",&local_41);
  to_string<unsigned_long>(&local_78,local_20);
  std::operator+(__return_storage_ptr__,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::string GetMeshId( size_t pIndex) const {
        return std::string( "meshId" ) + to_string(pIndex);
    }